

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char cVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 bi_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_2;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 ai_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  NodeRef stack [244];
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar65._4_4_ = fVar3;
  auVar65._0_4_ = fVar3;
  auVar65._8_4_ = fVar3;
  auVar65._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar83._4_4_ = fVar4;
  auVar83._0_4_ = fVar4;
  auVar83._8_4_ = fVar4;
  auVar83._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar86._4_4_ = fVar5;
  auVar86._0_4_ = fVar5;
  auVar86._8_4_ = fVar5;
  auVar86._12_4_ = fVar5;
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar46 = ZEXT416((uint)(fVar9 * 0.99999964));
  auVar46 = vshufps_avx(auVar46,auVar46,0);
  auVar47 = ZEXT416((uint)(fVar66 * 0.99999964));
  auVar47 = vshufps_avx(auVar47,auVar47,0);
  auVar40 = ZEXT416((uint)(fVar72 * 0.99999964));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar26 = ZEXT416((uint)(fVar9 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar27 = ZEXT416((uint)(fVar66 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  auVar28 = ZEXT416((uint)(fVar72 * 1.0000004));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar79._4_4_ = iVar10;
  auVar79._0_4_ = iVar10;
  auVar79._8_4_ = iVar10;
  auVar79._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  puVar23 = local_7d0;
LAB_00f0f883:
  puVar22 = puVar23;
  if (puVar22 == &local_7d8) {
LAB_00f0fdcc:
    return puVar22 != &local_7d8;
  }
  puVar23 = puVar22 + -1;
  uVar24 = puVar22[-1];
  do {
    fVar9 = *(float *)(ray + k * 4 + 0x70);
    auVar29._4_4_ = fVar9;
    auVar29._0_4_ = fVar9;
    auVar29._8_4_ = fVar9;
    auVar29._12_4_ = fVar9;
    fVar66 = 1.0 - fVar9;
    auVar13 = vshufps_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66),0);
    auVar14 = vshufps_avx(ZEXT416((uint)(fVar66 * 0.0)),ZEXT416((uint)(fVar66 * 0.0)),0);
    do {
      if ((uVar24 & 8) != 0) {
        cVar16 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar24 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar16 == '\0') goto LAB_00f0f883;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_00f0fdcc;
      }
      uVar18 = (uint)uVar24 & 7;
      uVar17 = uVar24 & 0xfffffffffffffff0;
      if (uVar18 == 3) {
        auVar67._0_4_ =
             fVar6 * *(float *)(uVar17 + 0x20) +
             *(float *)(uVar17 + 0x50) * fVar7 + *(float *)(uVar17 + 0x80) * fVar8;
        auVar67._4_4_ =
             fVar6 * *(float *)(uVar17 + 0x24) +
             *(float *)(uVar17 + 0x54) * fVar7 + *(float *)(uVar17 + 0x84) * fVar8;
        auVar67._8_4_ =
             fVar6 * *(float *)(uVar17 + 0x28) +
             *(float *)(uVar17 + 0x58) * fVar7 + *(float *)(uVar17 + 0x88) * fVar8;
        auVar67._12_4_ =
             fVar6 * *(float *)(uVar17 + 0x2c) +
             *(float *)(uVar17 + 0x5c) * fVar7 + *(float *)(uVar17 + 0x8c) * fVar8;
        auVar73._0_4_ =
             fVar6 * *(float *)(uVar17 + 0x30) +
             fVar7 * *(float *)(uVar17 + 0x60) + *(float *)(uVar17 + 0x90) * fVar8;
        auVar73._4_4_ =
             fVar6 * *(float *)(uVar17 + 0x34) +
             fVar7 * *(float *)(uVar17 + 100) + *(float *)(uVar17 + 0x94) * fVar8;
        auVar73._8_4_ =
             fVar6 * *(float *)(uVar17 + 0x38) +
             fVar7 * *(float *)(uVar17 + 0x68) + *(float *)(uVar17 + 0x98) * fVar8;
        auVar73._12_4_ =
             fVar6 * *(float *)(uVar17 + 0x3c) +
             fVar7 * *(float *)(uVar17 + 0x6c) + *(float *)(uVar17 + 0x9c) * fVar8;
        auVar84._0_4_ =
             fVar6 * *(float *)(uVar17 + 0x40) +
             fVar7 * *(float *)(uVar17 + 0x70) + *(float *)(uVar17 + 0xa0) * fVar8;
        auVar84._4_4_ =
             fVar6 * *(float *)(uVar17 + 0x44) +
             fVar7 * *(float *)(uVar17 + 0x74) + *(float *)(uVar17 + 0xa4) * fVar8;
        auVar84._8_4_ =
             fVar6 * *(float *)(uVar17 + 0x48) +
             fVar7 * *(float *)(uVar17 + 0x78) + *(float *)(uVar17 + 0xa8) * fVar8;
        auVar84._12_4_ =
             fVar6 * *(float *)(uVar17 + 0x4c) +
             fVar7 * *(float *)(uVar17 + 0x7c) + *(float *)(uVar17 + 0xac) * fVar8;
        auVar35._8_4_ = 0x7fffffff;
        auVar35._0_8_ = 0x7fffffff7fffffff;
        auVar35._12_4_ = 0x7fffffff;
        auVar34 = vandps_avx(auVar67,auVar35);
        auVar39._8_4_ = 0x219392ef;
        auVar39._0_8_ = 0x219392ef219392ef;
        auVar39._12_4_ = 0x219392ef;
        auVar34 = vcmpps_avx(auVar34,auVar39,1);
        auVar12 = vblendvps_avx(auVar67,auVar39,auVar34);
        auVar34 = vandps_avx(auVar73,auVar35);
        auVar34 = vcmpps_avx(auVar34,auVar39,1);
        auVar37 = vblendvps_avx(auVar73,auVar39,auVar34);
        auVar34 = vandps_avx(auVar84,auVar35);
        auVar34 = vcmpps_avx(auVar34,auVar39,1);
        auVar34 = vblendvps_avx(auVar84,auVar39,auVar34);
        auVar35 = vrcpps_avx(auVar12);
        fVar66 = auVar35._0_4_;
        auVar68._0_4_ = auVar12._0_4_ * fVar66;
        fVar69 = auVar35._4_4_;
        auVar68._4_4_ = auVar12._4_4_ * fVar69;
        fVar70 = auVar35._8_4_;
        auVar68._8_4_ = auVar12._8_4_ * fVar70;
        fVar71 = auVar35._12_4_;
        auVar68._12_4_ = auVar12._12_4_ * fVar71;
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar12 = vsubps_avx(auVar36,auVar68);
        fVar66 = fVar66 + fVar66 * auVar12._0_4_;
        fVar69 = fVar69 + fVar69 * auVar12._4_4_;
        fVar70 = fVar70 + fVar70 * auVar12._8_4_;
        fVar71 = fVar71 + fVar71 * auVar12._12_4_;
        auVar12 = vrcpps_avx(auVar37);
        fVar72 = auVar12._0_4_;
        auVar74._0_4_ = auVar37._0_4_ * fVar72;
        fVar75 = auVar12._4_4_;
        auVar74._4_4_ = auVar37._4_4_ * fVar75;
        fVar76 = auVar12._8_4_;
        auVar74._8_4_ = auVar37._8_4_ * fVar76;
        fVar77 = auVar12._12_4_;
        auVar74._12_4_ = auVar37._12_4_ * fVar77;
        auVar12 = vsubps_avx(auVar36,auVar74);
        fVar72 = fVar72 + fVar72 * auVar12._0_4_;
        fVar75 = fVar75 + fVar75 * auVar12._4_4_;
        fVar76 = fVar76 + fVar76 * auVar12._8_4_;
        fVar77 = fVar77 + fVar77 * auVar12._12_4_;
        auVar12 = vrcpps_avx(auVar34);
        fVar78 = auVar12._0_4_;
        auVar85._0_4_ = auVar34._0_4_ * fVar78;
        fVar80 = auVar12._4_4_;
        auVar85._4_4_ = auVar34._4_4_ * fVar80;
        fVar81 = auVar12._8_4_;
        auVar85._8_4_ = auVar34._8_4_ * fVar81;
        fVar82 = auVar12._12_4_;
        auVar85._12_4_ = auVar34._12_4_ * fVar82;
        auVar34 = vsubps_avx(auVar36,auVar85);
        fVar78 = fVar78 + fVar78 * auVar34._0_4_;
        fVar80 = fVar80 + fVar80 * auVar34._4_4_;
        fVar81 = fVar81 + fVar81 * auVar34._8_4_;
        fVar82 = fVar82 + fVar82 * auVar34._12_4_;
        auVar37._0_4_ =
             fVar3 * *(float *)(uVar17 + 0x20) +
             fVar4 * *(float *)(uVar17 + 0x50) +
             *(float *)(uVar17 + 0x80) * fVar5 + *(float *)(uVar17 + 0xb0);
        auVar37._4_4_ =
             fVar3 * *(float *)(uVar17 + 0x24) +
             fVar4 * *(float *)(uVar17 + 0x54) +
             *(float *)(uVar17 + 0x84) * fVar5 + *(float *)(uVar17 + 0xb4);
        auVar37._8_4_ =
             fVar3 * *(float *)(uVar17 + 0x28) +
             fVar4 * *(float *)(uVar17 + 0x58) +
             *(float *)(uVar17 + 0x88) * fVar5 + *(float *)(uVar17 + 0xb8);
        auVar37._12_4_ =
             fVar3 * *(float *)(uVar17 + 0x2c) +
             fVar4 * *(float *)(uVar17 + 0x5c) +
             *(float *)(uVar17 + 0x8c) * fVar5 + *(float *)(uVar17 + 0xbc);
        auVar52._0_4_ =
             fVar3 * *(float *)(uVar17 + 0x30) +
             fVar5 * *(float *)(uVar17 + 0x90) + *(float *)(uVar17 + 0xc0) +
             fVar4 * *(float *)(uVar17 + 0x60);
        auVar52._4_4_ =
             fVar3 * *(float *)(uVar17 + 0x34) +
             fVar5 * *(float *)(uVar17 + 0x94) + *(float *)(uVar17 + 0xc4) +
             fVar4 * *(float *)(uVar17 + 100);
        auVar52._8_4_ =
             fVar3 * *(float *)(uVar17 + 0x38) +
             fVar5 * *(float *)(uVar17 + 0x98) + *(float *)(uVar17 + 200) +
             fVar4 * *(float *)(uVar17 + 0x68);
        auVar52._12_4_ =
             fVar3 * *(float *)(uVar17 + 0x3c) +
             fVar5 * *(float *)(uVar17 + 0x9c) + *(float *)(uVar17 + 0xcc) +
             fVar4 * *(float *)(uVar17 + 0x6c);
        local_8d8 = auVar14._0_4_;
        fStack_8d4 = auVar14._4_4_;
        fStack_8d0 = auVar14._8_4_;
        fStack_8cc = auVar14._12_4_;
        auVar64._0_4_ = fVar9 * *(float *)(uVar17 + 0xe0) + local_8d8;
        auVar64._4_4_ = fVar9 * *(float *)(uVar17 + 0xe4) + fStack_8d4;
        auVar64._8_4_ = fVar9 * *(float *)(uVar17 + 0xe8) + fStack_8d0;
        auVar64._12_4_ = fVar9 * *(float *)(uVar17 + 0xec) + fStack_8cc;
        auVar56._0_4_ = local_8d8 + fVar9 * *(float *)(uVar17 + 0xf0);
        auVar56._4_4_ = fStack_8d4 + fVar9 * *(float *)(uVar17 + 0xf4);
        auVar56._8_4_ = fStack_8d0 + fVar9 * *(float *)(uVar17 + 0xf8);
        auVar56._12_4_ = fStack_8cc + fVar9 * *(float *)(uVar17 + 0xfc);
        auVar62._0_4_ = local_8d8 + fVar9 * *(float *)(uVar17 + 0x100);
        auVar62._4_4_ = fStack_8d4 + fVar9 * *(float *)(uVar17 + 0x104);
        auVar62._8_4_ = fStack_8d0 + fVar9 * *(float *)(uVar17 + 0x108);
        auVar62._12_4_ = fStack_8cc + fVar9 * *(float *)(uVar17 + 0x10c);
        auVar43._0_4_ =
             fVar3 * *(float *)(uVar17 + 0x40) +
             fVar5 * *(float *)(uVar17 + 0xa0) + *(float *)(uVar17 + 0xd0) +
             fVar4 * *(float *)(uVar17 + 0x70);
        auVar43._4_4_ =
             fVar3 * *(float *)(uVar17 + 0x44) +
             fVar5 * *(float *)(uVar17 + 0xa4) + *(float *)(uVar17 + 0xd4) +
             fVar4 * *(float *)(uVar17 + 0x74);
        auVar43._8_4_ =
             fVar3 * *(float *)(uVar17 + 0x48) +
             fVar5 * *(float *)(uVar17 + 0xa8) + *(float *)(uVar17 + 0xd8) +
             fVar4 * *(float *)(uVar17 + 0x78);
        auVar43._12_4_ =
             fVar3 * *(float *)(uVar17 + 0x4c) +
             fVar5 * *(float *)(uVar17 + 0xac) + *(float *)(uVar17 + 0xdc) +
             fVar4 * *(float *)(uVar17 + 0x7c);
        local_8c8 = auVar13._0_4_;
        fStack_8c4 = auVar13._4_4_;
        fStack_8c0 = auVar13._8_4_;
        fStack_8bc = auVar13._12_4_;
        auVar58._0_4_ = local_8c8 + fVar9 * *(float *)(uVar17 + 0x110);
        auVar58._4_4_ = fStack_8c4 + fVar9 * *(float *)(uVar17 + 0x114);
        auVar58._8_4_ = fStack_8c0 + fVar9 * *(float *)(uVar17 + 0x118);
        auVar58._12_4_ = fStack_8bc + fVar9 * *(float *)(uVar17 + 0x11c);
        auVar34 = vsubps_avx(auVar64,auVar37);
        auVar12 = vsubps_avx(auVar58,auVar37);
        auVar59._0_4_ = local_8c8 + fVar9 * *(float *)(uVar17 + 0x120);
        auVar59._4_4_ = fStack_8c4 + fVar9 * *(float *)(uVar17 + 0x124);
        auVar59._8_4_ = fStack_8c0 + fVar9 * *(float *)(uVar17 + 0x128);
        auVar59._12_4_ = fStack_8bc + fVar9 * *(float *)(uVar17 + 300);
        auVar37 = vsubps_avx(auVar56,auVar52);
        auVar35 = vsubps_avx(auVar59,auVar52);
        auVar60._0_4_ = local_8c8 + fVar9 * *(float *)(uVar17 + 0x130);
        auVar60._4_4_ = fStack_8c4 + fVar9 * *(float *)(uVar17 + 0x134);
        auVar60._8_4_ = fStack_8c0 + fVar9 * *(float *)(uVar17 + 0x138);
        auVar60._12_4_ = fStack_8bc + fVar9 * *(float *)(uVar17 + 0x13c);
        auVar36 = vsubps_avx(auVar62,auVar43);
        auVar39 = vsubps_avx(auVar60,auVar43);
        auVar61._0_4_ = auVar34._0_4_ * fVar66;
        auVar61._4_4_ = auVar34._4_4_ * fVar69;
        auVar61._8_4_ = auVar34._8_4_ * fVar70;
        auVar61._12_4_ = auVar34._12_4_ * fVar71;
        auVar38._0_4_ = fVar66 * auVar12._0_4_;
        auVar38._4_4_ = fVar69 * auVar12._4_4_;
        auVar38._8_4_ = fVar70 * auVar12._8_4_;
        auVar38._12_4_ = fVar71 * auVar12._12_4_;
        auVar57._0_4_ = fVar72 * auVar37._0_4_;
        auVar57._4_4_ = fVar75 * auVar37._4_4_;
        auVar57._8_4_ = fVar76 * auVar37._8_4_;
        auVar57._12_4_ = fVar77 * auVar37._12_4_;
        auVar63._0_4_ = fVar78 * auVar36._0_4_;
        auVar63._4_4_ = fVar80 * auVar36._4_4_;
        auVar63._8_4_ = fVar81 * auVar36._8_4_;
        auVar63._12_4_ = fVar82 * auVar36._12_4_;
        auVar53._0_4_ = fVar72 * auVar35._0_4_;
        auVar53._4_4_ = fVar75 * auVar35._4_4_;
        auVar53._8_4_ = fVar76 * auVar35._8_4_;
        auVar53._12_4_ = fVar77 * auVar35._12_4_;
        auVar44._0_4_ = fVar78 * auVar39._0_4_;
        auVar44._4_4_ = fVar80 * auVar39._4_4_;
        auVar44._8_4_ = fVar81 * auVar39._8_4_;
        auVar44._12_4_ = fVar82 * auVar39._12_4_;
        auVar34 = vpminsd_avx(auVar57,auVar53);
        auVar12 = vpminsd_avx(auVar63,auVar44);
        auVar34 = vmaxps_avx(auVar34,auVar12);
        auVar36 = vpminsd_avx(auVar61,auVar38);
        auVar35 = vpmaxsd_avx(auVar61,auVar38);
        auVar12 = vpmaxsd_avx(auVar57,auVar53);
        auVar37 = vpmaxsd_avx(auVar63,auVar44);
        auVar37 = vminps_avx(auVar12,auVar37);
        auVar12 = vmaxps_avx(auVar79,auVar36);
        auVar34 = vmaxps_avx(auVar12,auVar34);
        auVar12._4_4_ = iVar10;
        auVar12._0_4_ = iVar10;
        auVar12._8_4_ = iVar10;
        auVar12._12_4_ = iVar10;
        auVar12 = vminps_avx(auVar12,auVar35);
        auVar12 = vminps_avx(auVar12,auVar37);
        auVar45._0_4_ = auVar34._0_4_ * 0.99999964;
        auVar45._4_4_ = auVar34._4_4_ * 0.99999964;
        auVar45._8_4_ = auVar34._8_4_ * 0.99999964;
        auVar45._12_4_ = auVar34._12_4_ * 0.99999964;
        auVar34._0_4_ = auVar12._0_4_ * 1.0000004;
        auVar34._4_4_ = auVar12._4_4_ * 1.0000004;
        auVar34._8_4_ = auVar12._8_4_ * 1.0000004;
        auVar34._12_4_ = auVar12._12_4_ * 1.0000004;
        auVar34 = vcmpps_avx(auVar45,auVar34,2);
      }
      else {
        pfVar2 = (float *)(uVar17 + 0x80 + uVar20);
        pfVar1 = (float *)(uVar17 + 0x20 + uVar20);
        auVar30._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar30._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar30._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar30._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar34 = vsubps_avx(auVar30,auVar65);
        pfVar2 = (float *)(uVar17 + 0x80 + uVar25);
        auVar31._0_4_ = auVar46._0_4_ * auVar34._0_4_;
        auVar31._4_4_ = auVar46._4_4_ * auVar34._4_4_;
        auVar31._8_4_ = auVar46._8_4_ * auVar34._8_4_;
        auVar31._12_4_ = auVar46._12_4_ * auVar34._12_4_;
        pfVar1 = (float *)(uVar17 + 0x20 + uVar25);
        auVar41._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar41._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar41._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar41._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar34 = vsubps_avx(auVar41,auVar83);
        pfVar2 = (float *)(uVar17 + 0x80 + uVar21);
        pfVar1 = (float *)(uVar17 + 0x20 + uVar21);
        auVar48._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar48._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar48._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar48._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar42._0_4_ = auVar47._0_4_ * auVar34._0_4_;
        auVar42._4_4_ = auVar47._4_4_ * auVar34._4_4_;
        auVar42._8_4_ = auVar47._8_4_ * auVar34._8_4_;
        auVar42._12_4_ = auVar47._12_4_ * auVar34._12_4_;
        auVar34 = vsubps_avx(auVar48,auVar86);
        auVar49._0_4_ = auVar40._0_4_ * auVar34._0_4_;
        auVar49._4_4_ = auVar40._4_4_ * auVar34._4_4_;
        auVar49._8_4_ = auVar40._8_4_ * auVar34._8_4_;
        auVar49._12_4_ = auVar40._12_4_ * auVar34._12_4_;
        auVar34 = vmaxps_avx(auVar42,auVar49);
        auVar12 = vmaxps_avx(auVar79,auVar31);
        auVar34 = vmaxps_avx(auVar12,auVar34);
        pfVar2 = (float *)(uVar17 + 0x80 + (uVar20 ^ 0x10));
        pfVar1 = (float *)(uVar17 + 0x20 + (uVar20 ^ 0x10));
        auVar32._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar32._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar32._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar32._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar12 = vsubps_avx(auVar32,auVar65);
        auVar33._0_4_ = auVar26._0_4_ * auVar12._0_4_;
        auVar33._4_4_ = auVar26._4_4_ * auVar12._4_4_;
        auVar33._8_4_ = auVar26._8_4_ * auVar12._8_4_;
        auVar33._12_4_ = auVar26._12_4_ * auVar12._12_4_;
        pfVar2 = (float *)(uVar17 + 0x80 + (uVar25 ^ 0x10));
        pfVar1 = (float *)(uVar17 + 0x20 + (uVar25 ^ 0x10));
        auVar50._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar50._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar50._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar50._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar12 = vsubps_avx(auVar50,auVar83);
        auVar51._0_4_ = auVar27._0_4_ * auVar12._0_4_;
        auVar51._4_4_ = auVar27._4_4_ * auVar12._4_4_;
        auVar51._8_4_ = auVar27._8_4_ * auVar12._8_4_;
        auVar51._12_4_ = auVar27._12_4_ * auVar12._12_4_;
        pfVar2 = (float *)(uVar17 + 0x80 + (uVar21 ^ 0x10));
        pfVar1 = (float *)(uVar17 + 0x20 + (uVar21 ^ 0x10));
        auVar54._0_4_ = fVar9 * *pfVar2 + *pfVar1;
        auVar54._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
        auVar54._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
        auVar54._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
        auVar12 = vsubps_avx(auVar54,auVar86);
        auVar55._0_4_ = auVar28._0_4_ * auVar12._0_4_;
        auVar55._4_4_ = auVar28._4_4_ * auVar12._4_4_;
        auVar55._8_4_ = auVar28._8_4_ * auVar12._8_4_;
        auVar55._12_4_ = auVar28._12_4_ * auVar12._12_4_;
        auVar12 = vminps_avx(auVar51,auVar55);
        auVar15._4_4_ = iVar10;
        auVar15._0_4_ = iVar10;
        auVar15._8_4_ = iVar10;
        auVar15._12_4_ = iVar10;
        auVar37 = vminps_avx(auVar15,auVar33);
        auVar12 = vminps_avx(auVar37,auVar12);
        if (uVar18 == 6) {
          auVar12 = vcmpps_avx(auVar34,auVar12,2);
          auVar34 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0xe0),auVar29,2);
          auVar37 = vcmpps_avx(auVar29,*(undefined1 (*) [16])(uVar17 + 0xf0),1);
          auVar34 = vandps_avx(auVar34,auVar37);
          auVar34 = vandps_avx(auVar34,auVar12);
        }
        else {
          auVar34 = vcmpps_avx(auVar34,auVar12,2);
        }
      }
      auVar34 = vpslld_avx(auVar34,0x1f);
      uVar18 = vmovmskps_avx(auVar34);
      if (uVar18 == 0) goto LAB_00f0f883;
      uVar18 = uVar18 & 0xff;
      lVar11 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      uVar24 = *(ulong *)(uVar17 + lVar11 * 8);
      uVar18 = uVar18 - 1 & uVar18;
      uVar19 = (ulong)uVar18;
    } while (uVar18 == 0);
    do {
      *puVar23 = uVar24;
      puVar23 = puVar23 + 1;
      lVar11 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      uVar24 = *(ulong *)(uVar17 + lVar11 * 8);
      uVar19 = uVar19 - 1 & uVar19;
    } while (uVar19 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }